

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O3

int AndersonAcc(KINMem kin_mem,N_Vector gval,N_Vector fv,N_Vector x,N_Vector xold,int iter,
               realtype *R,realtype *gamma)

{
  ulong uVar1;
  double dVar2;
  int *piVar3;
  realtype *c;
  N_Vector *X;
  N_Vector y;
  uint uVar4;
  int extraout_EAX;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  realtype *prVar11;
  ulong uVar12;
  long lVar13;
  double *pdVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  realtype rVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar29;
  undefined1 auVar28 [16];
  
  piVar3 = kin_mem->kin_ipt_map;
  c = kin_mem->kin_cv;
  X = kin_mem->kin_Xv;
  uVar4 = iter - 1;
  lVar6 = (long)(int)uVar4;
  uVar10 = lVar6 % kin_mem->kin_m_aa;
  N_VLinearSum(1.0,gval,-1.0,xold,fv);
  if (0 < iter) {
    N_VLinearSum(1.0,gval,-1.0,kin_mem->kin_gold_aa,kin_mem->kin_dg_aa[uVar10]);
    N_VLinearSum(1.0,fv,-1.0,kin_mem->kin_fold_aa,kin_mem->kin_df_aa[uVar10]);
  }
  N_VScale(1.0,gval,kin_mem->kin_gold_aa);
  N_VScale(1.0,fv,kin_mem->kin_fold_aa);
  if (iter == 1) {
    rVar21 = N_VDotProd(kin_mem->kin_df_aa[uVar10],kin_mem->kin_df_aa[uVar10]);
    if (rVar21 < 0.0) {
      dVar22 = sqrt(rVar21);
    }
    else {
      dVar22 = SQRT(rVar21);
    }
    *R = dVar22;
    N_VScale(1.0 / dVar22,kin_mem->kin_df_aa[uVar10],kin_mem->kin_q_aa[uVar10]);
    *piVar3 = 0;
    lVar18 = 1;
  }
  else {
    if (iter == 0) {
      N_VScale(1.0,gval,x);
      return extraout_EAX;
    }
    lVar18 = (long)iter;
    lVar7 = kin_mem->kin_m_aa;
    if (lVar7 < lVar18) {
      if (1 < lVar7) {
        lVar17 = 2;
        lVar13 = 0x10;
        prVar11 = R;
        lVar6 = 0;
        do {
          lVar19 = lVar6 + 1;
          lVar8 = lVar7 * lVar19;
          dVar22 = R[lVar8 + lVar6];
          dVar2 = R[lVar8 + lVar6 + 1];
          auVar24._8_8_ = dVar22;
          auVar24._0_8_ = dVar2;
          auVar25._0_8_ = SQRT(dVar22 * dVar22 + dVar2 * dVar2);
          R[lVar8 + lVar6] = auVar25._0_8_;
          auVar25._8_8_ = auVar25._0_8_;
          auVar25 = divpd(auVar24,auVar25);
          R[lVar8 + lVar6 + 1] = 0.0;
          rVar21 = auVar25._0_8_;
          dVar22 = auVar25._8_8_;
          if ((lVar6 < lVar7 + -1) && (lVar6 + 2 < lVar7)) {
            lVar9 = lVar7 * lVar13;
            lVar8 = lVar17;
            do {
              dVar2 = *(double *)((long)prVar11 + lVar9 + 8);
              auVar26._0_8_ = *(double *)((long)prVar11 + lVar9) * dVar22 + dVar2 * rVar21;
              auVar26._8_8_ = *(double *)((long)prVar11 + lVar9) * -rVar21 + dVar2 * dVar22;
              *(undefined1 (*) [16])((long)prVar11 + lVar9) = auVar26;
              lVar8 = lVar8 + 1;
              lVar9 = lVar9 + lVar7 * 8;
            } while (lVar8 < lVar7);
          }
          N_VLinearSum(dVar22,kin_mem->kin_q_aa[lVar6],rVar21,kin_mem->kin_q_aa[lVar19],
                       kin_mem->kin_vtemp2);
          y = kin_mem->kin_q_aa[lVar19];
          N_VLinearSum(-rVar21,kin_mem->kin_q_aa[lVar6],dVar22,y,y);
          N_VScale(1.0,kin_mem->kin_vtemp2,kin_mem->kin_q_aa[lVar6]);
          lVar7 = kin_mem->kin_m_aa;
          lVar17 = lVar17 + 1;
          prVar11 = prVar11 + 1;
          lVar13 = lVar13 + 8;
          lVar6 = lVar19;
        } while (lVar19 < lVar7 + -1);
        if (1 < lVar7) {
          lVar6 = 1;
          prVar11 = R;
          do {
            lVar13 = 1;
            do {
              prVar11[lVar13 + -1] = (prVar11 + lVar7)[lVar13 + -1];
              lVar13 = lVar13 + 1;
            } while (lVar7 != lVar13);
            lVar6 = lVar6 + 1;
            prVar11 = prVar11 + lVar7;
          } while (lVar6 != lVar7);
        }
      }
      N_VScale(1.0,kin_mem->kin_df_aa[uVar10],kin_mem->kin_vtemp2);
      if (1 < kin_mem->kin_m_aa) {
        lVar6 = 0;
        do {
          rVar21 = N_VDotProd(kin_mem->kin_q_aa[lVar6],kin_mem->kin_vtemp2);
          R[(kin_mem->kin_m_aa + -1) * kin_mem->kin_m_aa + lVar6] = rVar21;
          N_VLinearSum(1.0,kin_mem->kin_vtemp2,-rVar21,kin_mem->kin_q_aa[lVar6],kin_mem->kin_vtemp2)
          ;
          lVar6 = lVar6 + 1;
        } while (lVar6 < kin_mem->kin_m_aa + -1);
      }
      rVar21 = N_VDotProd(kin_mem->kin_vtemp2,kin_mem->kin_vtemp2);
      if (rVar21 < 0.0) {
        dVar22 = sqrt(rVar21);
      }
      else {
        dVar22 = SQRT(rVar21);
      }
      lVar6 = kin_mem->kin_m_aa;
      R[lVar6 * lVar6 + -1] = dVar22;
      N_VScale(1.0 / dVar22,kin_mem->kin_vtemp2,kin_mem->kin_q_aa[lVar6 + -1]);
      lVar6 = kin_mem->kin_m_aa;
      uVar4 = (uint)uVar10;
      if ((int)(uVar4 + 1) < lVar6) {
        uVar12 = 0;
        do {
          piVar3[uVar12] = uVar4 + 1 + (int)uVar12;
          lVar7 = (long)(int)(uVar4 + 1) + uVar12;
          uVar12 = uVar12 + 1;
        } while (lVar7 + 1 < lVar6);
        uVar12 = uVar12 & 0xffffffff;
      }
      else {
        uVar12 = 0;
      }
      auVar26 = _DAT_0011d0f0;
      auVar24 = _DAT_0011d0e0;
      auVar25 = _DAT_0011d0d0;
      if (-1 < (long)uVar10) {
        auVar23._0_8_ = uVar10 & 0xffffffff;
        auVar23._8_4_ = uVar4;
        auVar23._12_4_ = 0;
        lVar6 = 0;
        auVar23 = auVar23 ^ _DAT_0011d0f0;
        do {
          iVar16 = (int)lVar6;
          auVar27._8_4_ = iVar16;
          auVar27._0_8_ = lVar6;
          auVar27._12_4_ = (int)((ulong)lVar6 >> 0x20);
          auVar28 = (auVar27 | auVar24) ^ auVar26;
          iVar5 = auVar23._4_4_;
          if ((bool)(~(auVar28._4_4_ == iVar5 && auVar23._0_4_ < auVar28._0_4_ ||
                      iVar5 < auVar28._4_4_) & 1)) {
            piVar3[uVar12 + lVar6] = iVar16;
          }
          if ((auVar28._12_4_ != auVar23._12_4_ || auVar28._8_4_ <= auVar23._8_4_) &&
              auVar28._12_4_ <= auVar23._12_4_) {
            piVar3[uVar12 + lVar6 + 1] = iVar16 + 1;
          }
          auVar27 = (auVar27 | auVar25) ^ auVar26;
          iVar29 = auVar27._4_4_;
          if (iVar29 <= iVar5 && (iVar29 != iVar5 || auVar27._0_4_ <= auVar23._0_4_)) {
            piVar3[uVar12 + lVar6 + 2] = iVar16 + 2;
            piVar3[uVar12 + lVar6 + 3] = iVar16 + 3;
          }
          lVar6 = lVar6 + 4;
        } while (((uVar10 & 0xffffffff) - (ulong)(uVar4 & 3)) + 4 != lVar6);
      }
    }
    else {
      N_VScale(1.0,kin_mem->kin_df_aa[uVar10],kin_mem->kin_vtemp2);
      if (1 < iter) {
        uVar12 = 0;
        do {
          piVar3[uVar12] = (int)uVar12;
          rVar21 = N_VDotProd(kin_mem->kin_q_aa[uVar12],kin_mem->kin_vtemp2);
          *(realtype *)((long)R + uVar12 * 8 + kin_mem->kin_m_aa * lVar6 * 8) = rVar21;
          N_VLinearSum(1.0,kin_mem->kin_vtemp2,-rVar21,kin_mem->kin_q_aa[uVar12],kin_mem->kin_vtemp2
                      );
          uVar12 = uVar12 + 1;
        } while (uVar4 != uVar12);
      }
      rVar21 = N_VDotProd(kin_mem->kin_vtemp2,kin_mem->kin_vtemp2);
      if (rVar21 < 0.0) {
        dVar22 = sqrt(rVar21);
      }
      else {
        dVar22 = SQRT(rVar21);
      }
      R[kin_mem->kin_m_aa * lVar6 + lVar18 + -1] = dVar22;
      N_VScale(1.0 / dVar22,kin_mem->kin_vtemp2,kin_mem->kin_q_aa[uVar10]);
      piVar3[lVar6] = uVar4;
    }
  }
  uVar10 = (ulong)(uint)iter;
  if (kin_mem->kin_m_aa < lVar18) {
    uVar10 = kin_mem->kin_m_aa;
  }
  uVar12 = uVar10 & 0xffffffff;
  iVar16 = (int)uVar10;
  iVar5 = N_VDotProdMulti(iVar16,fv,kin_mem->kin_q_aa,gamma);
  if (iVar5 != 0) {
    return iVar5;
  }
  *c = 1.0;
  *X = gval;
  if (iVar16 < 1) {
    uVar4 = 1;
  }
  else {
    lVar6 = kin_mem->kin_m_aa;
    uVar4 = iVar16 + 1;
    prVar11 = gamma + uVar12;
    pdVar14 = (double *)((long)R + (lVar6 * 8 + 8) * uVar12 + -8);
    uVar15 = 1;
    uVar10 = uVar12;
    do {
      uVar1 = uVar10 - 1;
      if ((long)uVar10 < (long)uVar12) {
        dVar22 = gamma[uVar1];
        lVar18 = 0;
        pdVar20 = pdVar14;
        do {
          dVar22 = dVar22 - *pdVar20 * prVar11[lVar18];
          gamma[uVar1] = dVar22;
          lVar18 = lVar18 + 1;
          pdVar20 = pdVar20 + lVar6;
        } while ((int)uVar10 + (int)lVar18 < iVar16);
      }
      else {
        dVar22 = gamma[uVar1];
      }
      dVar2 = R[(lVar6 + 1) * uVar1];
      gamma[uVar1] = dVar22 / dVar2;
      c[uVar15] = -(dVar22 / dVar2);
      X[uVar15] = kin_mem->kin_dg_aa[piVar3[uVar1]];
      uVar15 = uVar15 + 1;
      prVar11 = prVar11 + -1;
      pdVar14 = (double *)((long)pdVar14 + (lVar6 * 8 ^ 0xfffffffffffffff8U));
      uVar10 = uVar1;
    } while (uVar15 != uVar4);
  }
  iVar5 = N_VLinearCombination(uVar4,c,X,x);
  return iVar5;
}

Assistant:

static int AndersonAcc(KINMem kin_mem, N_Vector gval, N_Vector fv, 
		       N_Vector x, N_Vector xold, 
		       int iter, realtype *R, realtype *gamma)
{
  int i_pt, i, j, lAA, retval;
  int *ipt_map;
  realtype alfa;
  realtype a, b, temp, c, s;

  /* local shortcuts for fused vector operation */
  int       nvec=0;
  realtype* cv=kin_mem->kin_cv;
  N_Vector* Xv=kin_mem->kin_Xv;

  ipt_map = kin_mem->kin_ipt_map;
  i_pt = iter-1 - ((iter-1)/kin_mem->kin_m_aa)*kin_mem->kin_m_aa;
  N_VLinearSum(ONE, gval, -1.0, xold, fv);
  if (iter > 0) {
    /* compute dg_new = gval -gval_old*/
    N_VLinearSum(ONE, gval, -1.0, kin_mem->kin_gold_aa, kin_mem->kin_dg_aa[i_pt]);
    /* compute df_new = fval - fval_old */
    N_VLinearSum(ONE, fv, -1.0, kin_mem->kin_fold_aa, kin_mem->kin_df_aa[i_pt]);
  }

  N_VScale(ONE, gval, kin_mem->kin_gold_aa);
  N_VScale(ONE, fv, kin_mem->kin_fold_aa);

  if (iter == 0) {
    N_VScale(ONE, gval, x);
  }
  else {
    if (iter == 1) {
      R[0] = sqrt(N_VDotProd(kin_mem->kin_df_aa[i_pt], kin_mem->kin_df_aa[i_pt]));
      alfa = 1/R[0];
      N_VScale(alfa, kin_mem->kin_df_aa[i_pt], kin_mem->kin_q_aa[i_pt]);
      ipt_map[0] = 0;
    }
    else if (iter <= kin_mem->kin_m_aa) {
      N_VScale(ONE, kin_mem->kin_df_aa[i_pt], kin_mem->kin_vtemp2);
      for (j=0; j < (iter-1); j++) {
        ipt_map[j] = j;
        R[(iter-1)*kin_mem->kin_m_aa+j] = N_VDotProd(kin_mem->kin_q_aa[j], kin_mem->kin_vtemp2);
        N_VLinearSum(ONE,kin_mem->kin_vtemp2, -R[(iter-1)*kin_mem->kin_m_aa+j], kin_mem->kin_q_aa[j], kin_mem->kin_vtemp2);
      }
      R[(iter-1)*kin_mem->kin_m_aa+iter-1] = sqrt(N_VDotProd(kin_mem->kin_vtemp2, kin_mem->kin_vtemp2));
      N_VScale((1/R[(iter-1)*kin_mem->kin_m_aa+iter-1]), kin_mem->kin_vtemp2, kin_mem->kin_q_aa[i_pt]);
      ipt_map[iter-1] = iter-1;
    }
    else {
      /* Delete left-most column vector from QR factorization */
      for (i=0; i < kin_mem->kin_m_aa-1; i++) {
        a = R[(i+1)*kin_mem->kin_m_aa + i];
        b = R[(i+1)*kin_mem->kin_m_aa + i+1];
        temp = sqrt(a*a + b*b);
        c = a / temp;
        s = b / temp;
        R[(i+1)*kin_mem->kin_m_aa + i] = temp;
        R[(i+1)*kin_mem->kin_m_aa + i+1] = 0.0;
	/* OK to re-use temp */
        if (i < kin_mem->kin_m_aa-1) {
          for (j = i+2; j < kin_mem->kin_m_aa; j++) {
            a = R[j*kin_mem->kin_m_aa + i];
            b = R[j*kin_mem->kin_m_aa + i+1];
            temp = c * a + s * b;
            R[j*kin_mem->kin_m_aa + i+1] = -s*a + c*b;
            R[j*kin_mem->kin_m_aa + i] = temp;
	  }
	}
        N_VLinearSum(c, kin_mem->kin_q_aa[i], s, kin_mem->kin_q_aa[i+1], kin_mem->kin_vtemp2);
        N_VLinearSum(-s, kin_mem->kin_q_aa[i], c, kin_mem->kin_q_aa[i+1], kin_mem->kin_q_aa[i+1]);
        N_VScale(ONE, kin_mem->kin_vtemp2, kin_mem->kin_q_aa[i]);
      }

      /* Shift R to the left by one. */
      for (i = 1; i < kin_mem->kin_m_aa; i++) {
        for (j = 0; j < kin_mem->kin_m_aa-1; j++) {
          R[(i-1)*kin_mem->kin_m_aa + j] = R[i*kin_mem->kin_m_aa + j];
        }
      }

      /* Add the new df vector */
      N_VScale(ONE, kin_mem->kin_df_aa[i_pt], kin_mem->kin_vtemp2);
      for (j=0; j < (kin_mem->kin_m_aa-1); j++) {
        R[(kin_mem->kin_m_aa-1)*kin_mem->kin_m_aa+j] = N_VDotProd(kin_mem->kin_q_aa[j], kin_mem->kin_vtemp2);
        N_VLinearSum(ONE, kin_mem->kin_vtemp2, -R[(kin_mem->kin_m_aa-1)*kin_mem->kin_m_aa+j], kin_mem->kin_q_aa[j],kin_mem->kin_vtemp2);
      }
      R[(kin_mem->kin_m_aa-1)*kin_mem->kin_m_aa+kin_mem->kin_m_aa-1] = sqrt(N_VDotProd(kin_mem->kin_vtemp2, kin_mem->kin_vtemp2));
      N_VScale((1/R[(kin_mem->kin_m_aa-1)*kin_mem->kin_m_aa+kin_mem->kin_m_aa-1]), kin_mem->kin_vtemp2, kin_mem->kin_q_aa[kin_mem->kin_m_aa-1]);

      /* Update the iteration map */
      j = 0;
      for (i=i_pt+1; i < kin_mem->kin_m_aa; i++)
        ipt_map[j++] = i;
      for (i=0; i < (i_pt+1); i++)
        ipt_map[j++] = i;
    }

    /* Solve least squares problem and update solution */
    lAA = iter;
    if (kin_mem->kin_m_aa < iter) lAA = kin_mem->kin_m_aa;

    retval = N_VDotProdMulti(lAA, fv, kin_mem->kin_q_aa, gamma);
    if (retval != KIN_SUCCESS) return(KIN_VECTOROP_ERR);

    /* set arrays for fused vector operation */
    cv[0] = ONE;
    Xv[0] = gval;
    nvec = 1;

    for (i=lAA-1; i > -1; i--) {
      for (j=i+1; j < lAA; j++) {
        gamma[i] = gamma[i]-R[j*kin_mem->kin_m_aa+i]*gamma[j]; 
      }
      gamma[i] = gamma[i]/R[i*kin_mem->kin_m_aa+i];

      cv[nvec] = -gamma[i];
      Xv[nvec] = kin_mem->kin_dg_aa[ipt_map[i]];
      nvec += 1;
    }

    /* update solution */
    retval = N_VLinearCombination(nvec, cv, Xv, x);
    if (retval != KIN_SUCCESS) return(KIN_VECTOROP_ERR);

  }

  return 0;
}